

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

void __thiscall
UTF8Test_decode_codepoint_Test::UTF8Test_decode_codepoint_Test(UTF8Test_decode_codepoint_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a4d48;
  return;
}

Assistant:

TEST(UTF8Test, decode_codepoint) {
	DECODE_CODEPOINT_TEST(u8""sv, U'\0', 0U);
	DECODE_CODEPOINT_TEST(u8"\0"sv, U'\0', 1U);
	DECODE_CODEPOINT_TEST(u8"A"sv, U'A', 1U);
	DECODE_CODEPOINT_TEST(u8"z"sv, U'z', 1U);
	DECODE_CODEPOINT_TEST(u8"\u007F"sv, U'\u007F', 1U);
	DECODE_CODEPOINT_TEST(u8"\u0080"sv, U'\u0080', 2U);
	DECODE_CODEPOINT_TEST(u8"\u07FF"sv, U'\u07FF', 2U);
	DECODE_CODEPOINT_TEST(u8"\u0800"sv, U'\u0800', 3U);
	DECODE_CODEPOINT_TEST(u8"\uFFFF"sv, U'\uFFFF', 3U);
	DECODE_CODEPOINT_TEST(u8"\U00010000"sv, U'\U00010000', 4U);
	DECODE_CODEPOINT_TEST(u8"\U0010FFFF"sv, U'\U0010FFFF', 4U);
	DECODE_CODEPOINT_TEST(u8"\U0001F604"sv, U'\U0001F604', 4U);
}